

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::NonAnsiUdpPortListSyntax::setChild
          (NonAnsiUdpPortListSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_004b6058 + *(int *)(&DAT_004b6058 + index * 4)))
            (&child,index,in_RDX,&DAT_004b6058 + *(int *)(&DAT_004b6058 + index * 4));
  return;
}

Assistant:

void NonAnsiUdpPortListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: ports = child.node()->as<SeparatedSyntaxList<IdentifierNameSyntax>>(); return;
        case 2: closeParen = child.token(); return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}